

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O2

ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *
llvm::MemoryBuffer::getFileOrSTDIN
          (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
           *__return_storage_ptr__,Twine *Filename,int64_t FileSize,bool RequiresNullTerminator)

{
  StringRef SVar1;
  SmallString<256U> NameBuf;
  SmallVectorImpl<char> local_130;
  undefined1 local_120 [256];
  
  local_130.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_120;
  local_130.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_130.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  SVar1 = Twine::toStringRef(Filename,&local_130);
  if ((SVar1.Length == 1) && (*SVar1.Data == '-')) {
    getSTDIN();
  }
  else {
    getFile(__return_storage_ptr__,Filename,FileSize,RequiresNullTerminator,false);
  }
  SmallVectorImpl<char>::~SmallVectorImpl(&local_130);
  return __return_storage_ptr__;
}

Assistant:

ErrorOr<std::unique_ptr<MemoryBuffer>>
MemoryBuffer::getFileOrSTDIN(const Twine &Filename, int64_t FileSize,
                             bool RequiresNullTerminator) {
  SmallString<256> NameBuf;
  StringRef NameRef = Filename.toStringRef(NameBuf);

  if (NameRef == "-")
    return getSTDIN();
  return getFile(Filename, FileSize, RequiresNullTerminator);
}